

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

LY_ERR lys_compile_depset_r(ly_ctx *ctx,ly_set *dep_set,lys_glob_unres *unres)

{
  lys_module *mod;
  uint uVar1;
  LY_ERR LVar2;
  ulong uVar3;
  lysf_ctx local_50;
  
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  uVar1 = dep_set->count;
  local_50.ctx = ctx;
  if (uVar1 != 0) {
    uVar3 = 0;
    do {
      mod = (lys_module *)(dep_set->field_2).dnodes[uVar3];
      if (mod->to_compile != '\0') {
        if (mod->implemented == '\0') {
          __assert_fail("mod->implemented",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                        ,0x5fa,
                        "LY_ERR lys_compile_depset_r(struct ly_ctx *, struct ly_set *, struct lys_glob_unres *)"
                       );
        }
        lysc_module_free(&local_50,mod->compiled);
        mod->compiled = (lysc_module *)0x0;
        LVar2 = lys_compile(mod,&unres->ds_unres);
        if (LVar2 != LY_SUCCESS) goto LAB_00141b4c;
        uVar1 = dep_set->count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
  }
  LVar2 = lys_compile_unres_depset(ctx,unres);
  if (LVar2 == LY_ERECOMPILE) {
    lys_compile_unres_depset_erase(ctx,unres);
    LVar2 = lys_compile_depset_r(ctx,dep_set,unres);
  }
  else {
    if (LVar2 == LY_SUCCESS) {
      uVar1 = dep_set->count;
      LVar2 = LY_SUCCESS;
      if ((ulong)uVar1 != 0) {
        uVar3 = 0;
        do {
          *(undefined1 *)((long)&(dep_set->field_2).dnodes[uVar3][2].schema + 1) = 0;
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
    }
LAB_00141b4c:
    if (local_50.ext_set.count != 0) {
      __assert_fail("!fctx.ext_set.count",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0x616,
                    "LY_ERR lys_compile_depset_r(struct ly_ctx *, struct ly_set *, struct lys_glob_unres *)"
                   );
    }
    lys_compile_unres_depset_erase(ctx,unres);
  }
  return LVar2;
}

Assistant:

static LY_ERR
lys_compile_depset_r(struct ly_ctx *ctx, struct ly_set *dep_set, struct lys_glob_unres *unres)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysf_ctx fctx = {.ctx = ctx};
    struct lys_module *mod;
    uint32_t i;

    for (i = 0; i < dep_set->count; ++i) {
        mod = dep_set->objs[i];
        if (!mod->to_compile) {
            /* skip */
            continue;
        }
        assert(mod->implemented);

        /* free the compiled module, if any */
        lysc_module_free(&fctx, mod->compiled);
        mod->compiled = NULL;

        /* (re)compile the module */
        LY_CHECK_GOTO(ret = lys_compile(mod, &unres->ds_unres), cleanup);
    }

    /* resolve dep set unres */
    ret = lys_compile_unres_depset(ctx, unres);
    if (ret == LY_ERECOMPILE) {
        /* new module is implemented, discard current dep set unres and recompile the whole dep set */
        lys_compile_unres_depset_erase(ctx, unres);
        return lys_compile_depset_r(ctx, dep_set, unres);
    } else if (ret) {
        /* error */
        goto cleanup;
    }

    /* success, unset the flags of all the modules in the dep set */
    for (i = 0; i < dep_set->count; ++i) {
        mod = dep_set->objs[i];
        mod->to_compile = 0;
    }

cleanup:
    assert(!fctx.ext_set.count);
    lys_compile_unres_depset_erase(ctx, unres);
    return ret;
}